

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O3

void Abc_FrameSwapCurrentAndBackup(Abc_Frame_t *p)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  
  pAVar3 = p->pNtkCur;
  pAVar4 = pAVar3->pNetBackup;
  if (pAVar4 != (Abc_Ntk_t *)0x0) {
    iVar1 = pAVar3->iStep;
    iVar2 = pAVar4->iStep;
    pAVar3->pNetBackup = pAVar4->pNetBackup;
    pAVar3->iStep = iVar2;
    pAVar4->pNetBackup = pAVar3;
    pAVar4->iStep = iVar1;
    p->pNtkCur = pAVar4;
  }
  return;
}

Assistant:

void Abc_FrameSwapCurrentAndBackup( Abc_Frame_t * p )
{
    Abc_Ntk_t * pNtkCur, * pNtkBack, * pNtkBack2;
    int iStepCur, iStepBack;

    pNtkCur  = p->pNtkCur;
    pNtkBack = Abc_NtkBackup( pNtkCur );
    iStepCur = Abc_NtkStep  ( pNtkCur );

    // if there is no backup nothing to reset
    if ( pNtkBack == NULL )
        return;

    // remember the backup of the backup
    pNtkBack2 = Abc_NtkBackup( pNtkBack );
    iStepBack = Abc_NtkStep  ( pNtkBack );

    // set pNtkCur to be the next after the backup's backup
    Abc_NtkSetBackup( pNtkCur, pNtkBack2 );
    Abc_NtkSetStep  ( pNtkCur, iStepBack );

    // set pNtkCur to be the next after the backup
    Abc_NtkSetBackup( pNtkBack, pNtkCur );
    Abc_NtkSetStep  ( pNtkBack, iStepCur );

    // set the current network
    p->pNtkCur = pNtkBack;
}